

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHalf.h
# Opt level: O3

void Ptex::v2_2::PtexUtils::(anonymous_namespace)::ApplyConst<Ptex::v2_2::PtexHalf,3>
               (float weight,float *dst,void *data,int param_4)

{
  *(ulong *)dst =
       CONCAT44(weight * *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)data + 2) * 4) +
                (float)((ulong)*(undefined8 *)dst >> 0x20),
                weight * *(float *)(PtexHalf::h2fTable + (ulong)*data * 4) +
                (float)*(undefined8 *)dst);
  dst[2] = weight * *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)data + 4) * 4) + dst[2]
  ;
  return;
}

Assistant:

operator float() const { return toFloat(bits); }